

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsontz.cpp
# Opt level: O2

UBool __thiscall
icu_63::OlsonTimeZone::getPreviousTransition
          (OlsonTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  TimeArrayTimeZoneRule *this_00;
  TimeArrayTimeZoneRule *this_01;
  UBool UVar1;
  short transIdx;
  short sVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TimeZoneTransition *right;
  UDate UVar6;
  double dVar7;
  UErrorCode status;
  UnicodeString toName;
  UnicodeString fromName;
  UErrorCode local_b4;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_b4 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_b4);
  if (U_ZERO_ERROR < local_b4) {
    return '\0';
  }
  if (this->finalZone != (SimpleTimeZone *)0x0) {
    if (inclusive == '\0') {
LAB_00201b0d:
      UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if (base <= UVar6) goto LAB_00201b5b;
      iVar3 = (*(this->finalZone->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[9]
              )();
      if ((char)iVar3 != '\0') {
        iVar3 = (*(this->finalZoneWithStartYear->super_BasicTimeZone).super_TimeZone.super_UObject.
                  _vptr_UObject[0xf])
                          (base,this->finalZoneWithStartYear,(ulong)(uint)(int)inclusive,result);
        return (UBool)iVar3;
      }
    }
    else {
      UVar6 = TimeZoneTransition::getTime(this->firstFinalTZTransition);
      if ((UVar6 != base) || (NAN(UVar6) || NAN(base))) goto LAB_00201b0d;
    }
    right = this->firstFinalTZTransition;
LAB_00201be9:
    TimeZoneTransition::operator=(result,right);
    return '\x01';
  }
LAB_00201b5b:
  if (this->historicRules == (TimeArrayTimeZoneRule **)0x0) {
    return '\0';
  }
  transIdx = this->transitionCount32 + this->transitionCountPre32 + this->transitionCountPost32;
  do {
    transIdx = transIdx + -1;
    sVar2 = this->firstTZTransitionIdx;
    if (transIdx < sVar2) goto LAB_00201bcd;
    dVar7 = transitionTime(this,transIdx);
  } while ((base <= dVar7) && (inclusive == '\0' || dVar7 != base));
  sVar2 = this->firstTZTransitionIdx;
LAB_00201bcd:
  if (transIdx < sVar2) {
    return '\0';
  }
  if (transIdx == sVar2) {
    right = this->firstTZTransition;
    goto LAB_00201be9;
  }
  this_00 = this->historicRules[this->typeMapData[transIdx]];
  this_01 = this->historicRules[this->typeMapData[(long)transIdx + -1]];
  dVar7 = transitionTime(this,transIdx);
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003e4bf0;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  TimeZoneRule::getName(&this_01->super_TimeZoneRule,&local_70);
  TimeZoneRule::getName(&this_00->super_TimeZoneRule,&local_b0);
  UVar1 = UnicodeString::operator==(&local_70,&local_b0);
  if (UVar1 != '\0') {
    iVar4 = TimeZoneRule::getRawOffset(&this_01->super_TimeZoneRule);
    iVar5 = TimeZoneRule::getRawOffset(&this_00->super_TimeZoneRule);
    if (iVar4 == iVar5) {
      iVar4 = TimeZoneRule::getDSTSavings(&this_01->super_TimeZoneRule);
      iVar5 = TimeZoneRule::getDSTSavings(&this_00->super_TimeZoneRule);
      if (iVar4 == iVar5) {
        iVar3 = (*(this->super_BasicTimeZone).super_TimeZone.super_UObject._vptr_UObject[0xf])
                          (dVar7,this,0,result);
        UVar1 = (UBool)iVar3;
        goto LAB_00201cf5;
      }
    }
  }
  TimeZoneTransition::setTime(result,dVar7);
  iVar3 = (*(this_01->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_01);
  TimeZoneTransition::adoptFrom(result,(TimeZoneRule *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*(this_00->super_TimeZoneRule).super_UObject._vptr_UObject[3])(this_00);
  UVar1 = '\x01';
  TimeZoneTransition::adoptTo(result,(TimeZoneRule *)CONCAT44(extraout_var_00,iVar3));
LAB_00201cf5:
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_70);
  return UVar1;
}

Assistant:

UBool
OlsonTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    if (finalZone != NULL) {
        if (inclusive && base == firstFinalTZTransition->getTime()) {
            result = *firstFinalTZTransition;
            return TRUE;
        } else if (base > firstFinalTZTransition->getTime()) {
            if (finalZone->useDaylightTime()) {
                //return finalZone->getPreviousTransition(base, inclusive, result);
                return finalZoneWithStartYear->getPreviousTransition(base, inclusive, result);
            } else {
                result = *firstFinalTZTransition;
                return TRUE;
            }
        }
    }

    if (historicRules != NULL) {
        // Find a historical transition
        int16_t ttidx = transitionCount() - 1;
        for (; ttidx >= firstTZTransitionIdx; ttidx--) {
            UDate t = (UDate)transitionTime(ttidx);
            if (base > t || (inclusive && base == t)) {
                break;
            }
        }
        if (ttidx < firstTZTransitionIdx) {
            // No more transitions
            return FALSE;
        } else if (ttidx == firstTZTransitionIdx) {
            result = *firstTZTransition;
            return TRUE;
        } else {
            // Create a TimeZoneTransition
            TimeZoneRule *to = historicRules[typeMapData[ttidx]];
            TimeZoneRule *from = historicRules[typeMapData[ttidx-1]];
            UDate startTime = (UDate)transitionTime(ttidx);

            // The transitions loaded from zoneinfo.res may contain non-transition data
            UnicodeString fromName, toName;
            from->getName(fromName);
            to->getName(toName);
            if (fromName == toName && from->getRawOffset() == to->getRawOffset()
                    && from->getDSTSavings() == to->getDSTSavings()) {
                return getPreviousTransition(startTime, false, result);
            }
            result.setTime(startTime);
            result.adoptFrom(from->clone());
            result.adoptTo(to->clone());
            return TRUE;
        }
    }
    return FALSE;
}